

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

string * __thiscall antlr::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  (*this->_vptr_Token[4])(local_40);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x251383);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80.field_2._8_8_ = plVar2[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_80._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  operator+(&local_60,&local_80,this->type);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Token::toString() const
{
	return "[\""+getText()+"\",<"+type+">]";
}